

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O2

void __thiscall
wasm::TraceCalls::parseFunctionName
          (TraceCalls *this,string *str,string *originName,string *traceName)

{
  long lVar1;
  undefined1 local_1d0 [392];
  undefined1 local_48 [8];
  Split parts;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,":",(allocator<char> *)&parts.field_0x1f);
  String::Split::Split((Split *)local_48,str,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  lVar1 = (long)parts.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 5;
  if (lVar1 == 1) {
    std::__cxx11::string::_M_assign((string *)originName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   "trace_",originName);
    std::__cxx11::string::operator=((string *)traceName,(string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  else {
    if (lVar1 != 2) {
      Fatal::Fatal((Fatal *)local_1d0);
      std::operator<<((ostream *)(local_1d0 + 0x10),"Failed to parse function name (\'");
      std::operator<<((ostream *)(local_1d0 + 0x10),(string *)str);
      Fatal::operator<<((Fatal *)local_1d0,
                        (char (*) [52])"\'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]");
      Fatal::~Fatal((Fatal *)local_1d0);
    }
    std::__cxx11::string::_M_assign((string *)originName);
    std::__cxx11::string::_M_assign((string *)traceName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return;
}

Assistant:

void parseFunctionName(const std::string& str,
                         std::string& originName,
                         std::string& traceName) {
    auto parts = String::Split(str, ":");
    switch (parts.size()) {
      case 1:
        originName = parts[0];
        traceName = "trace_" + originName;
        break;
      case 2:
        originName = parts[0];
        traceName = parts[1];
        break;
      default:
        Fatal() << "Failed to parse function name ('" << str
                << "'): expected format FUNCTION_TO_TRACE[:TRACER_NAME]";
    }
  }